

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_meter.cpp
# Opt level: O0

void Meter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QColor *pQVar5;
  QString *pQVar6;
  Data *pDVar7;
  void *_v_1;
  Meter *_t_2;
  QString *local_40;
  void *_v;
  Meter *_t_1;
  int *result;
  Meter *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (Meter *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    if (_id == 0) {
      valueChanged((Meter *)_o,*_a[1]);
    }
    else if (_id == 1) {
      thresholdFired((Meter *)_o,*_a[1]);
    }
    else if (_id == 2) {
      setValue((Meter *)_o,*_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == valueChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    else {
      pcVar1 = *_a[1];
      if (pcVar1 == thresholdFired && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 1;
      }
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (QString *)*_a;
    _v = _o;
    switch(_id) {
    case 0:
      pDVar7 = (Data *)minValue((Meter *)_o);
      (local_40->d).d = pDVar7;
      break;
    case 1:
      pDVar7 = (Data *)maxValue((Meter *)_o);
      (local_40->d).d = pDVar7;
      break;
    case 2:
      pDVar7 = (Data *)value((Meter *)_o);
      (local_40->d).d = pDVar7;
      break;
    case 3:
      pQVar5 = backgroundColor((Meter *)_o);
      (local_40->d).d = *(Data **)pQVar5;
      *(undefined4 *)&(local_40->d).ptr = *(undefined4 *)((long)&pQVar5->ct + 4);
      *(ushort *)((long)&(local_40->d).ptr + 4) = (pQVar5->ct).argb.pad;
      break;
    case 4:
      pQVar5 = needleColor((Meter *)_o);
      (local_40->d).d = *(Data **)pQVar5;
      *(undefined4 *)&(local_40->d).ptr = *(undefined4 *)((long)&pQVar5->ct + 4);
      *(ushort *)((long)&(local_40->d).ptr + 4) = (pQVar5->ct).argb.pad;
      break;
    case 5:
      pQVar5 = textColor((Meter *)_o);
      (local_40->d).d = *(Data **)pQVar5;
      *(undefined4 *)&(local_40->d).ptr = *(undefined4 *)((long)&pQVar5->ct + 4);
      *(ushort *)((long)&(local_40->d).ptr + 4) = (pQVar5->ct).argb.pad;
      break;
    case 6:
      pQVar5 = gridColor((Meter *)_o);
      (local_40->d).d = *(Data **)pQVar5;
      *(undefined4 *)&(local_40->d).ptr = *(undefined4 *)((long)&pQVar5->ct + 4);
      *(ushort *)((long)&(local_40->d).ptr + 4) = (pQVar5->ct).argb.pad;
      break;
    case 7:
      pQVar6 = label((Meter *)_o);
      QString::operator=(local_40,(QString *)pQVar6);
      break;
    case 8:
      unitsLabel((QString *)&_t_2,(Meter *)_o);
      QString::operator=(local_40,(QString *)&_t_2);
      QString::~QString((QString *)&_t_2);
      break;
    case 9:
      uVar3 = radius((Meter *)_o);
      *(uint *)&(local_40->d).d = uVar3;
      break;
    case 10:
      uVar3 = startScaleAngle((Meter *)_o);
      *(uint *)&(local_40->d).d = uVar3;
      break;
    case 0xb:
      uVar3 = stopScaleAngle((Meter *)_o);
      *(uint *)&(local_40->d).d = uVar3;
      break;
    case 0xc:
      pDVar7 = (Data *)scaleStep((Meter *)_o);
      (local_40->d).d = pDVar7;
      break;
    case 0xd:
      pDVar7 = (Data *)scaleGridStep((Meter *)_o);
      (local_40->d).d = pDVar7;
      break;
    case 0xe:
      bVar2 = drawValue((Meter *)_o);
      *(bool *)&(local_40->d).d = bVar2;
      break;
    case 0xf:
      bVar2 = drawGridValues((Meter *)_o);
      *(bool *)&(local_40->d).d = bVar2;
      break;
    case 0x10:
      iVar4 = drawValuePrecision((Meter *)_o);
      *(int *)&(local_40->d).d = iVar4;
      break;
    case 0x11:
      iVar4 = scaleLabelPrecision((Meter *)_o);
      *(int *)&(local_40->d).d = iVar4;
    }
  }
  else if (_c == WriteProperty) {
    pQVar5 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setMinValue((Meter *)_o,*(qreal *)pQVar5);
      break;
    case 1:
      setMaxValue((Meter *)_o,*(qreal *)pQVar5);
      break;
    case 2:
      setValue((Meter *)_o,*(qreal *)pQVar5);
      break;
    case 3:
      setBackgroundColor((Meter *)_o,pQVar5);
      break;
    case 4:
      setNeedleColor((Meter *)_o,pQVar5);
      break;
    case 5:
      setTextColor((Meter *)_o,pQVar5);
      break;
    case 6:
      setGridColor((Meter *)_o,pQVar5);
      break;
    case 7:
      setLabel((Meter *)_o,(QString *)pQVar5);
      break;
    case 8:
      setUnitsLabel((Meter *)_o,(QString *)pQVar5);
      break;
    case 9:
      setRadius((Meter *)_o,pQVar5->cspec);
      break;
    case 10:
      setStartScaleAngle((Meter *)_o,pQVar5->cspec);
      break;
    case 0xb:
      setStopScaleAngle((Meter *)_o,pQVar5->cspec);
      break;
    case 0xc:
      setScaleStep((Meter *)_o,*(qreal *)pQVar5);
      break;
    case 0xd:
      setScaleGridStep((Meter *)_o,*(qreal *)pQVar5);
      break;
    case 0xe:
      setDrawValue((Meter *)_o,(bool)((char)pQVar5->cspec & Rgb));
      break;
    case 0xf:
      setDrawGridValues((Meter *)_o,(bool)((char)pQVar5->cspec & Rgb));
      break;
    case 0x10:
      setDrawValuePrecision((Meter *)_o,pQVar5->cspec);
      break;
    case 0x11:
      setScaleLabelPrecision((Meter *)_o,pQVar5->cspec);
    }
  }
  return;
}

Assistant:

void Meter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->thresholdFired((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setValue((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Meter::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Meter::valueChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Meter::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Meter::thresholdFired)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< qreal*>(_v) = _t->minValue(); break;
        case 1: *reinterpret_cast< qreal*>(_v) = _t->maxValue(); break;
        case 2: *reinterpret_cast< qreal*>(_v) = _t->value(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->backgroundColor(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->needleColor(); break;
        case 5: *reinterpret_cast< QColor*>(_v) = _t->textColor(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->gridColor(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->label(); break;
        case 8: *reinterpret_cast< QString*>(_v) = _t->unitsLabel(); break;
        case 9: *reinterpret_cast< uint*>(_v) = _t->radius(); break;
        case 10: *reinterpret_cast< uint*>(_v) = _t->startScaleAngle(); break;
        case 11: *reinterpret_cast< uint*>(_v) = _t->stopScaleAngle(); break;
        case 12: *reinterpret_cast< qreal*>(_v) = _t->scaleStep(); break;
        case 13: *reinterpret_cast< qreal*>(_v) = _t->scaleGridStep(); break;
        case 14: *reinterpret_cast< bool*>(_v) = _t->drawValue(); break;
        case 15: *reinterpret_cast< bool*>(_v) = _t->drawGridValues(); break;
        case 16: *reinterpret_cast< int*>(_v) = _t->drawValuePrecision(); break;
        case 17: *reinterpret_cast< int*>(_v) = _t->scaleLabelPrecision(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinValue(*reinterpret_cast< qreal*>(_v)); break;
        case 1: _t->setMaxValue(*reinterpret_cast< qreal*>(_v)); break;
        case 2: _t->setValue(*reinterpret_cast< qreal*>(_v)); break;
        case 3: _t->setBackgroundColor(*reinterpret_cast< QColor*>(_v)); break;
        case 4: _t->setNeedleColor(*reinterpret_cast< QColor*>(_v)); break;
        case 5: _t->setTextColor(*reinterpret_cast< QColor*>(_v)); break;
        case 6: _t->setGridColor(*reinterpret_cast< QColor*>(_v)); break;
        case 7: _t->setLabel(*reinterpret_cast< QString*>(_v)); break;
        case 8: _t->setUnitsLabel(*reinterpret_cast< QString*>(_v)); break;
        case 9: _t->setRadius(*reinterpret_cast< uint*>(_v)); break;
        case 10: _t->setStartScaleAngle(*reinterpret_cast< uint*>(_v)); break;
        case 11: _t->setStopScaleAngle(*reinterpret_cast< uint*>(_v)); break;
        case 12: _t->setScaleStep(*reinterpret_cast< qreal*>(_v)); break;
        case 13: _t->setScaleGridStep(*reinterpret_cast< qreal*>(_v)); break;
        case 14: _t->setDrawValue(*reinterpret_cast< bool*>(_v)); break;
        case 15: _t->setDrawGridValues(*reinterpret_cast< bool*>(_v)); break;
        case 16: _t->setDrawValuePrecision(*reinterpret_cast< int*>(_v)); break;
        case 17: _t->setScaleLabelPrecision(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}